

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O1

char * __thiscall OpenMD::ElementsTable::GetSymbol(ElementsTable *this,int atomicnum)

{
  pointer ppEVar1;
  char *pcVar2;
  
  if (this->init_ == false) {
    Init(this);
  }
  pcVar2 = "";
  if ((-1 < atomicnum) &&
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     atomicnum <
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3))) {
    pcVar2 = (ppEVar1[(uint)atomicnum]->symbol_)._M_dataplus._M_p;
  }
  return pcVar2;
}

Assistant:

const char* ElementsTable::GetSymbol(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return ("\0");

    return (elements_[atomicnum]->GetSymbol());
  }